

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O1

void __thiscall
UTF16Test_decode_codepoint_Test::~UTF16Test_decode_codepoint_Test
          (UTF16Test_decode_codepoint_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(UTF16Test, decode_codepoint) {
	DECODE_CODEPOINT_TEST(u""sv, U'\0', 0U);
	DECODE_CODEPOINT_TEST(u"\0"sv, U'\0', 1U);
	DECODE_CODEPOINT_TEST(u"A"sv, U'A', 1U);
	DECODE_CODEPOINT_TEST(u"z"sv, U'z', 1U);
	DECODE_CODEPOINT_TEST(u"\u007F"sv, U'\u007F', 1U);
	DECODE_CODEPOINT_TEST(u"\u0080"sv, U'\u0080', 1U);
	DECODE_CODEPOINT_TEST(u"\u07FF"sv, U'\u07FF', 1U);
	DECODE_CODEPOINT_TEST(u"\u0800"sv, U'\u0800', 1U);
	DECODE_CODEPOINT_TEST(u"\uD7FF"sv, U'\uD7FF', 1U);
	DECODE_CODEPOINT_TEST(u"\uE000"sv, U'\uE000', 1U);
	DECODE_CODEPOINT_TEST(u"\uFFFF"sv, U'\uFFFF', 1U);
	DECODE_CODEPOINT_TEST(u"\U00010000"sv, U'\U00010000', 2U);
	DECODE_CODEPOINT_TEST(u"\U0010FFFF"sv, U'\U0010FFFF', 2U);
	DECODE_CODEPOINT_TEST(u"\U0001F604"sv, U'\U0001F604', 2U);
}